

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O2

QStringList * __thiscall
QMimeDatabasePrivate::parents
          (QStringList *__return_storage_ptr__,QMimeDatabasePrivate *this,QString *mimeName)

{
  pointer puVar1;
  QMimeProviderBase *pQVar2;
  Providers *pPVar3;
  unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *provider;
  pointer puVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pPVar3 = providers(this);
  puVar1 = (pPVar3->
           super__Vector_base<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (pPVar3->
                super__Vector_base<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pQVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>._M_t.
             super__Tuple_impl<0UL,_QMimeProviderBase_*,_std::default_delete<QMimeProviderBase>_>.
             super__Head_base<0UL,_QMimeProviderBase_*,_false>._M_head_impl;
    (*pQVar2->_vptr_QMimeProviderBase[6])(pQVar2,mimeName,__return_storage_ptr__);
  }
  if ((__return_storage_ptr__->d).size == 0) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    fallbackParent((QString *)&local_48,this,mimeName);
    if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,(QString *)&local_48);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeDatabasePrivate::parents(const QString &mimeName)
{
    Q_ASSERT(!mutex.tryLock());
    QStringList result;
    for (const auto &provider : providers())
        provider->addParents(mimeName, result);
    if (result.isEmpty()) {
        const QString parent = fallbackParent(mimeName);
        if (!parent.isEmpty())
            result.append(parent);
    }
    return result;
}